

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# corner_detect.c
# Opt level: O0

CornerList * av1_alloc_corner_list(void)

{
  pthread_mutex_t *__mutex;
  CornerList *corners;
  size_t in_stack_fffffffffffffff0;
  size_t in_stack_fffffffffffffff8;
  
  __mutex = (pthread_mutex_t *)aom_calloc(in_stack_fffffffffffffff8,in_stack_fffffffffffffff0);
  if (__mutex == (pthread_mutex_t *)0x0) {
    __mutex = (pthread_mutex_t *)0x0;
  }
  else {
    __mutex[1].__size[0] = '\0';
    pthread_mutex_init(__mutex,(pthread_mutexattr_t *)0x0);
  }
  return (CornerList *)__mutex;
}

Assistant:

CornerList *av1_alloc_corner_list(void) {
  CornerList *corners = (CornerList *)aom_calloc(1, sizeof(*corners));
  if (!corners) {
    return NULL;
  }

  corners->valid = false;
#if CONFIG_MULTITHREAD
  pthread_mutex_init(&corners->mutex, NULL);
#endif  // CONFIG_MULTITHREAD
  return corners;
}